

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Annotation *
soul::createAnnotation
          (Annotation *__return_storage_ptr__,Annotation *a,StringDictionary *dictionary)

{
  bool bVar1;
  Expression *e;
  UnqualifiedName *this;
  mapped_type *this_00;
  string local_90;
  Expression local_60;
  reference local_48;
  Property *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  *__range1;
  StringDictionary *dictionary_local;
  Annotation *a_local;
  Annotation *result;
  
  SourceCodeModel::Annotation::Annotation(__return_storage_ptr__);
  __end1 = std::
           vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ::begin(&a->properties);
  p = (Property *)
      std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
      ::end(&a->properties);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
                                     *)&p), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
               ::operator*(&__end1);
    e = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_48->value);
    ExpressionHelpers::create(&local_60,e,dictionary);
    this = pool_ref<soul::AST::UnqualifiedName>::operator->(&local_48->name);
    AST::UnqualifiedName::toString_abi_cxx11_(&local_90,this);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>_>
              ::operator[](&__return_storage_ptr__->properties,&local_90);
    SourceCodeModel::Expression::operator=(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_90);
    SourceCodeModel::Expression::~Expression(&local_60);
    __gnu_cxx::
    __normal_iterator<const_soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Annotation createAnnotation (const AST::Annotation& a, const StringDictionary& dictionary)
{
    SourceCodeModel::Annotation result;

    for (auto& p : a.properties)
        result.properties[p.name->toString()] = ExpressionHelpers::create (p.value, dictionary);

    return result;
}